

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O0

void * QArrayData::allocate
                 (QArrayData **dptr,qsizetype objectSize,qsizetype alignment,qsizetype capacity,
                 AllocationOption option)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  AllocationResult AVar1;
  qsizetype unaff_retaddr;
  AllocationResult r;
  qsizetype alignment_00;
  
  alignment_00 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  AVar1 = allocateHelper(unaff_retaddr,alignment_00,-0x5555555555555556,0xaaaaaaaa);
  *in_RDI = AVar1.header;
  if (*(long *)(in_FS_OFFSET + 0x28) == alignment_00) {
    return AVar1.data;
  }
  __stack_chk_fail();
}

Assistant:

void *QArrayData::allocate(QArrayData **dptr, qsizetype objectSize, qsizetype alignment,
                           qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);
    // Alignment is a power of two
    Q_ASSERT(alignment >= qsizetype(alignof(QArrayData))
            && !(alignment & (alignment - 1)));

    auto r = allocateHelper(objectSize, alignment, capacity, option);
    *dptr = r.header;
    return r.data;
}